

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryTexture(aiTexture *tex)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  uint32_t local_14;
  uint32_t old;
  uint32_t len;
  aiTexture *tex_local;
  
  ofs = WriteMagic(0x1236);
  uVar1 = Write<unsigned_int>(&tex->mWidth);
  uVar2 = Write<unsigned_int>(&tex->mHeight);
  sVar4 = fwrite(tex->achFormatHint,1,4,(FILE *)out);
  local_14 = (int)sVar4 + uVar2 + uVar1;
  if ((shortened & 1U) == 0) {
    if (tex->mHeight == 0) {
      sVar4 = fwrite(tex->pcData,1,(ulong)tex->mWidth,(FILE *)out);
      iVar3 = (int)sVar4;
    }
    else {
      sVar4 = fwrite(tex->pcData,1,(ulong)(tex->mWidth * tex->mHeight * 4),(FILE *)out);
      iVar3 = (int)sVar4;
    }
    local_14 = iVar3 + local_14;
  }
  ChangeInteger(ofs,local_14);
  return local_14;
}

Assistant:

uint32_t WriteBinaryTexture(const aiTexture* tex)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AITEXTURE);

	len += Write<unsigned int>(tex->mWidth);
	len += Write<unsigned int>(tex->mHeight);
	len += static_cast<uint32_t>(fwrite(tex->achFormatHint,1,4,out));

	if(!shortened) {
		if (!tex->mHeight) {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth,out));
		}
		else {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth*tex->mHeight*4,out));
		}
	}

	ChangeInteger(old,len);
	return len;
}